

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileReader.cpp
# Opt level: O3

bool __thiscall FileReaderData::openStream(FileReaderData *this)

{
  int iVar1;
  
  (*(this->super_ReaderData)._vptr_ReaderData[3])();
  iVar1 = File::open(&this->m_file,(this->super_ReaderData).m_streamName._M_dataplus._M_p,1,0);
  return SUB41(iVar1,0);
}

Assistant:

bool FileReaderData::openStream()
{
    base_class::openStream();

    const bool rez = m_file.open(m_streamName.c_str(), File::ofRead);

    if (!rez)
    {
#ifdef _WIN32
        LPVOID msgBuf = nullptr;
        const DWORD dw = GetLastError();

        FormatMessageA(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM, nullptr, dw,
                       MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT), reinterpret_cast<LPSTR>(&msgBuf), 0, nullptr);

        string str(static_cast<char*>(msgBuf));
        LTRACE(LT_ERROR, 0, str);
#endif
    }

    return rez;
}